

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O1

void * evthread_posix_lock_alloc(uint locktype)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  pthread_mutexattr_t *__mutexattr;
  
  __mutex = (pthread_mutex_t *)event_mm_malloc_(0x28);
  if (__mutex != (pthread_mutex_t *)0x0) {
    __mutexattr = (pthread_mutexattr_t *)0x0;
    if ((locktype & 1) != 0) {
      __mutexattr = &attr_recursive;
    }
    iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)__mutexattr);
    if (iVar1 == 0) {
      return __mutex;
    }
    event_mm_free_(__mutex);
  }
  return (void *)0x0;
}

Assistant:

static void *
evthread_posix_lock_alloc(unsigned locktype)
{
	pthread_mutexattr_t *attr = NULL;
	pthread_mutex_t *lock = mm_malloc(sizeof(pthread_mutex_t));
	if (!lock)
		return NULL;
	if (locktype & EVTHREAD_LOCKTYPE_RECURSIVE)
		attr = &attr_recursive;
	if (pthread_mutex_init(lock, attr)) {
		mm_free(lock);
		return NULL;
	}
	return lock;
}